

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_internal.h
# Opt level: O2

uint get_quant_level(quant_method method)

{
  uint uVar1;
  
  uVar1 = 0;
  if (method < (QUANT_256|QUANT_3)) {
    uVar1 = *(uint *)(&DAT_0031af90 + (ulong)method * 4);
  }
  return uVar1;
}

Assistant:

static inline unsigned int get_quant_level(quant_method method)
{
	switch (method)
	{
	case QUANT_2:   return   2;
	case QUANT_3:   return   3;
	case QUANT_4:   return   4;
	case QUANT_5:   return   5;
	case QUANT_6:   return   6;
	case QUANT_8:   return   8;
	case QUANT_10:  return  10;
	case QUANT_12:  return  12;
	case QUANT_16:  return  16;
	case QUANT_20:  return  20;
	case QUANT_24:  return  24;
	case QUANT_32:  return  32;
	case QUANT_40:  return  40;
	case QUANT_48:  return  48;
	case QUANT_64:  return  64;
	case QUANT_80:  return  80;
	case QUANT_96:  return  96;
	case QUANT_128: return 128;
	case QUANT_160: return 160;
	case QUANT_192: return 192;
	case QUANT_256: return 256;
	}

	// Unreachable - the enum is fully described
	return 0;
}